

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageSizeCase::iterate(ImageSizeCase *this)

{
  TextureType imageType;
  undefined8 log_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 texture;
  GLSLVersion version;
  int iVar5;
  int iVar6;
  RenderContext *context;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__s;
  ProgramSources *sources;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *renderContext;
  TextureFormat *extraout_RDX;
  TextureFormat *pTVar8;
  deUint32 local_af4;
  deUint32 local_adc;
  deUint32 local_acc;
  char *local_a88;
  char *local_a80;
  char *local_a58;
  char *local_a50;
  R32UIImageSingleValueVerifier local_9b8;
  Vector<int,_3> local_9a4;
  TextureFormat local_998;
  deUint32 local_990;
  uint local_98c;
  deUint32 referenceOutput;
  UniformAccessLogger uniforms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  ShaderSource local_780;
  ProgramSources local_758;
  undefined1 local_688 [8];
  ShaderProgram program;
  undefined1 local_5b0 [8];
  string glslVersionDeclaration;
  string shaderImageTypeStr;
  string shaderImageFormatStr;
  char *shaderImageAccessStr;
  deUint32 local_53c;
  MessageBuilder local_538;
  deUint32 local_3b4;
  MessageBuilder local_3b0;
  deUint32 local_22c;
  MessageBuilder local_228;
  undefined1 local_a8 [8];
  Texture shaderOutResultTexture;
  Texture mainTexture;
  Buffer mainTextureBuf;
  deUint32 textureTargetGL;
  undefined1 local_40 [4];
  deUint32 internalFormatGL;
  CallLogWrapper glLog;
  TestLog *log;
  RenderContext *renderCtx;
  ImageSizeCase *this_local;
  
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glLog._16_8_ = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar2 = (*context->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_40,(Functions *)CONCAT44(extraout_var,iVar2),
             (TestLog *)glLog._16_8_);
  dVar3 = glu::getInternalFormat(this->m_format);
  dVar4 = Functional::getGLTextureTarget(this->m_imageType);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&mainTexture.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &shaderOutResultTexture.super_ObjectWrapper.m_object,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_a8,context);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_40,true);
  tcu::TestLog::operator<<
            (&local_228,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_228,(char (*) [28])"// Created a texture (name ");
  local_22c = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&shaderOutResultTexture.super_ObjectWrapper.m_object);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_22c);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_228);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    tcu::TestLog::operator<<
              (&local_3b0,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_3b0,(char (*) [43])"// Created a buffer for the texture (name ");
    local_3b4 = glu::ObjectWrapper::operator*
                          ((ObjectWrapper *)&mainTexture.super_ObjectWrapper.m_object);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3b4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3b0);
  }
  tcu::TestLog::operator<<
            (&local_538,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_538,(char (*) [28])"// Created a texture (name ");
  local_53c = glu::ObjectWrapper::operator*((ObjectWrapper *)local_a8);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_53c);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [32])") for storing the shader output");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_538);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c0);
  texture = glu::ObjectWrapper::operator*
                      ((ObjectWrapper *)&shaderOutResultTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,dVar4,texture);
  setTexParameteri((CallLogWrapper *)local_40,dVar4);
  imageType = this->m_imageType;
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&mainTexture.super_ObjectWrapper.m_object);
  setTextureStorage((CallLogWrapper *)local_40,imageType,dVar3,&this->m_imageSize,dVar4);
  dVar4 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)&shaderOutResultTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)local_40,0,dVar4,0,'\x01',0,0x88ba,dVar3);
  iVar2 = (*context->_vptr_RenderContext[3])();
  dVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(dVar3,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xaed);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c1);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_a8);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,0xde1,dVar3);
  setTexParameteri((CallLogWrapper *)local_40,0xde1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&shaderImageAccessStr,1,1,1);
  setTextureStorage((CallLogWrapper *)local_40,TEXTURETYPE_2D,0x8236,(IVec3 *)&shaderImageAccessStr,
                    0);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_a8);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)local_40,1,dVar3,0,'\x01',0,0x88b9,0x8236);
  iVar2 = (*context->_vptr_RenderContext[3])();
  dVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x800))();
  renderContext = (char *)0xaf4;
  glu::checkError(dVar3,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xaf4);
  pTVar8 = extraout_RDX;
  if (this->m_imageAccess == IMAGEACCESS_READ_ONLY) {
    local_a50 = "readonly";
  }
  else {
    if (this->m_imageAccess == IMAGEACCESS_WRITE_ONLY) {
      local_a58 = "writeonly";
    }
    else {
      pTVar8 = (TextureFormat *)(ulong)this->m_imageAccess;
      local_a58 = (char *)0x0;
      renderContext = "readonly writeonly";
      if (this->m_imageAccess == IMAGEACCESS_READ_ONLY_WRITE_ONLY) {
        local_a58 = "readonly writeonly";
      }
    }
    local_a50 = local_a58;
  }
  getShaderImageFormatQualifier_abi_cxx11_
            ((string *)((long)&shaderImageTypeStr.field_2 + 8),(Functional *)&this->m_format,pTVar8)
  ;
  getShaderImageType_abi_cxx11_
            ((string *)((long)&glslVersionDeclaration.field_2 + 8),
             (Functional *)(ulong)(this->m_format).type,this->m_imageType,(TextureType)renderContext
            );
  program.m_program.m_info.linkTimeUs._4_4_ = (*context->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  __s = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5b0,__s,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_758);
  std::operator+(&local_920,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,"\n"
                );
  textureTypeExtensionShaderRequires_abi_cxx11_
            ((string *)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
             ,(Functional *)(ulong)this->m_imageType,(TextureType)context,
             (RenderContext *)renderContext);
  std::operator+(&local_900,&local_920,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::operator+(&local_8e0,&local_900,"\nprecision highp ");
  std::operator+(&local_8c0,&local_8e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_8a0,&local_8c0,
                 ";\nprecision highp uimage2D;\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout ("
                );
  std::operator+(&local_880,&local_8a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&shaderImageTypeStr.field_2 + 8));
  std::operator+(&local_860,&local_880,", binding=0) ");
  std::operator+(&local_840,&local_860,local_a50);
  std::operator+(&local_820,&local_840," uniform ");
  std::operator+(&local_800,&local_820,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_7e0,&local_800,
                 " u_image;\nlayout (r32ui, binding=1) writeonly uniform uimage2D u_result;\nvoid main (void)\n{\n"
                );
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    local_a80 = "\tint result = imageSize(u_image);\n";
  }
  else {
    if ((this->m_imageType == TEXTURETYPE_2D) || (this->m_imageType == TEXTURETYPE_CUBE)) {
      local_a88 = "\tivec2 size = imageSize(u_image);\n\tint result = size.y*1000 + size.x;\n";
    }
    else {
      bVar1 = true;
      if (this->m_imageType != TEXTURETYPE_3D) {
        bVar1 = this->m_imageType == TEXTURETYPE_2D_ARRAY;
      }
      local_a88 = (char *)0x0;
      if (bVar1) {
        local_a88 = 
        "\tivec3 size = imageSize(u_image);\n\tint result = size.z*1000000 + size.y*1000 + size.x;\n"
        ;
      }
    }
    local_a80 = local_a88;
  }
  std::operator+(&local_7c0,&local_7e0,local_a80);
  std::operator+(&local_7a0,&local_7c0,"\timageStore(u_result, ivec2(0, 0), uvec4(result));\n}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_780,&local_7a0);
  sources = glu::ProgramSources::operator<<(&local_758,&local_780);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_688,context,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_780);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string
            ((string *)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  std::__cxx11::string::~string((string *)&local_920);
  glu::ProgramSources::~ProgramSources(&local_758);
  iVar2 = (*context->_vptr_RenderContext[3])();
  log_00 = glLog._16_8_;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_688);
  UniformAccessLogger::UniformAccessLogger
            ((UniformAccessLogger *)&referenceOutput,(Functions *)CONCAT44(extraout_var_02,iVar2),
             (TestLog *)log_00,dVar3);
  glu::operator<<((TestLog *)glLog._16_8_,(ShaderProgram *)local_688);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_688);
  if (bVar1) {
    dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_688);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_40,dVar3);
    glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)local_40,1,1,1);
    iVar2 = (*context->_vptr_RenderContext[3])();
    dVar3 = (**(code **)(CONCAT44(extraout_var_03,iVar2) + 0x800))();
    glu::checkError(dVar3,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xb2a);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
    this_local._4_4_ = STOP;
  }
  local_98c = (uint)!bVar1;
  UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)&referenceOutput);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_688);
  std::__cxx11::string::~string((string *)local_5b0);
  std::__cxx11::string::~string((string *)(glslVersionDeclaration.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(shaderImageTypeStr.field_2._M_local_buf + 8));
  if (local_98c == 0) {
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      local_acc = tcu::Vector<int,_3>::x(&this->m_imageSize);
    }
    else {
      if ((this->m_imageType == TEXTURETYPE_2D) || (this->m_imageType == TEXTURETYPE_CUBE)) {
        iVar2 = tcu::Vector<int,_3>::y(&this->m_imageSize);
        iVar5 = tcu::Vector<int,_3>::x(&this->m_imageSize);
        local_adc = iVar2 * 1000 + iVar5;
      }
      else {
        if ((this->m_imageType == TEXTURETYPE_3D) || (this->m_imageType == TEXTURETYPE_2D_ARRAY)) {
          iVar2 = tcu::Vector<int,_3>::z(&this->m_imageSize);
          iVar5 = tcu::Vector<int,_3>::y(&this->m_imageSize);
          iVar6 = tcu::Vector<int,_3>::x(&this->m_imageSize);
          local_af4 = iVar2 * 1000000 + iVar5 * 1000 + iVar6;
        }
        else {
          local_af4 = 0xffffffff;
        }
        local_adc = local_af4;
      }
      local_acc = local_adc;
    }
    local_990 = local_acc;
    dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_a8);
    tcu::TextureFormat::TextureFormat(&local_998,R,UNSIGNED_INT32);
    tcu::Vector<int,_3>::Vector(&local_9a4,1,1,1);
    R32UIImageSingleValueVerifier::R32UIImageSingleValueVerifier(&local_9b8,local_990);
    bVar1 = readIntegerTextureViaFBOAndVerify
                      (context,(CallLogWrapper *)local_40,dVar3,TEXTURETYPE_2D,&local_998,&local_9a4
                       ,&local_9b8.super_ImageLayerVerifier);
    R32UIImageSingleValueVerifier::~R32UIImageSingleValueVerifier(&local_9b8);
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got wrong value");
    }
    this_local._4_4_ = STOP;
    local_98c = 1;
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_a8);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &shaderOutResultTexture.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&mainTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_40);
  return this_local._4_4_;
}

Assistant:

ImageSizeCase::IterateResult ImageSizeCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const glu::Buffer			mainTextureBuf			(renderCtx);
	const glu::Texture			mainTexture				(renderCtx);
	const glu::Texture			shaderOutResultTexture	(renderCtx);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *mainTexture << ")" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *mainTextureBuf << ")" << TestLog::EndMessage;
	log << TestLog::Message << "// Created a texture (name " << *shaderOutResultTexture << ") for storing the shader output" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *mainTexture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_imageType, internalFormatGL, m_imageSize, *mainTextureBuf);
	glLog.glBindImageTexture(0, *mainTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(GL_TEXTURE_2D, *shaderOutResultTexture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	setTextureStorage(glLog, TEXTURETYPE_2D, GL_R32UI, IVec3(1, 1, 1), 0 /* always 2d texture, no buffer needed */);
	glLog.glBindImageTexture(1, *shaderOutResultTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Read texture size in compute shader.

	{
		// Generate compute shader.

		const char* const	shaderImageAccessStr	= m_imageAccess == IMAGEACCESS_READ_ONLY			? "readonly"
													: m_imageAccess == IMAGEACCESS_WRITE_ONLY			? "writeonly"
													: m_imageAccess == IMAGEACCESS_READ_ONLY_WRITE_ONLY	? "readonly writeonly"
													: DE_NULL;
		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"precision highp uimage2D;\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + shaderImageAccessStr + " uniform " + shaderImageTypeStr + " u_image;\n"
														"layout (r32ui, binding=1) writeonly uniform uimage2D u_result;\n"
														"void main (void)\n"
														"{\n"
														+ (m_imageType == TEXTURETYPE_BUFFER ?
															"	int result = imageSize(u_image);\n"
														 : m_imageType == TEXTURETYPE_2D || m_imageType == TEXTURETYPE_CUBE ?
															"	ivec2 size = imageSize(u_image);\n"
															"	int result = size.y*1000 + size.x;\n"
														 : m_imageType == TEXTURETYPE_3D || m_imageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 size = imageSize(u_image);\n"
															"	int result = size.z*1000000 + size.y*1000 + size.x;\n"
														 : DE_NULL) +
														"	imageStore(u_result, ivec2(0, 0), uvec4(result));\n"
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and compare to reference.

	{
		const deUint32	referenceOutput		= m_imageType == TEXTURETYPE_BUFFER										? (deUint32)(												  m_imageSize.x())
											: m_imageType == TEXTURETYPE_2D || m_imageType == TEXTURETYPE_CUBE		? (deUint32)(						   m_imageSize.y()*1000 + m_imageSize.x())
											: m_imageType == TEXTURETYPE_3D || m_imageType == TEXTURETYPE_2D_ARRAY	? (deUint32)(m_imageSize.z()*1000000 + m_imageSize.y()*1000 + m_imageSize.x())
											: (deUint32)-1;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *shaderOutResultTexture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(referenceOutput)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}